

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O3

bool sptk::GaussianMixtureModeling::CalculateLogProbability
               (int num_order,int num_mixture,bool is_diagonal,bool check_size,
               vector<double,_std::allocator<double>_> *input_vector,
               vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *mean_vectors,
               vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
               *covariance_matrices,
               vector<double,_std::allocator<double>_> *components_of_log_probability,
               double *log_probability,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *this_00;
  pointer pdVar1;
  ulong __new_size;
  bool bVar2;
  double *pdVar3;
  uint length;
  int m;
  uint column;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  size_type __new_size_00;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  vector<double,_std::allocator<double>_> diag;
  SymmetricMatrix tmp;
  vector<double,_std::allocator<double>_> local_98;
  ulong local_80;
  double local_78;
  undefined1 local_70 [16];
  uint local_60;
  
  if (-1 < num_mixture) {
    __new_size = (ulong)(uint)num_mixture;
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    length = num_order + 1;
    lVar8 = (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    __new_size_00 = lVar8 >> 3;
    if (__new_size_00 != (long)(int)length) {
      return false;
    }
    if ((!check_size) ||
       (bVar2 = anon_unknown.dwarf_154c5::CheckGmm
                          (num_mixture,length,
                           (vector<double,_std::allocator<double>_> *)
                           (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data._M_finish,
                           (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                           (mean_vectors->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start), bVar2)) {
      if ((components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) &&
         ((long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 3 != __new_size)) {
        std::vector<double,_std::allocator<double>_>::resize
                  (components_of_log_probability,__new_size);
      }
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != lVar8) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size_00);
      }
      this = &buffer->gconsts_;
      if ((long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this,__new_size);
      }
      this_00 = &buffer->precisions_;
      if ((long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6 != __new_size) {
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
                  (this_00,__new_size);
      }
      if (buffer->precomputed_ == false) {
        if (num_mixture != 0) {
          dVar14 = (double)(int)length * 1.8378770664093453;
          uVar9 = 0;
          do {
            if (is_diagonal) {
              if (num_order < 0) {
                dVar12 = 0.0;
              }
              else {
                column = 0;
                dVar12 = 0.0;
                do {
                  local_70._8_8_ =
                       (covariance_matrices->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9;
                  local_70._0_8_ = &PTR__Row_00117bb0;
                  local_60 = column;
                  pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,column);
                  dVar13 = log(*pdVar3);
                  dVar12 = dVar12 + dVar13;
                  column = column + 1;
                } while (length != column);
              }
              dVar12 = dVar12 + dVar14;
            }
            else {
              SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_70,0);
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (double *)0x0;
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (double *)0x0;
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar2 = SymmetricMatrix::CholeskyDecomposition
                                ((covariance_matrices->
                                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                 (SymmetricMatrix *)local_70,&local_98);
              pdVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              dVar12 = dVar14;
              if (bVar2) {
                dVar13 = 0.0;
                dVar12 = 0.0;
                pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  do {
                    dVar12 = log(*pdVar4);
                    dVar13 = dVar13 + dVar12;
                    pdVar4 = pdVar4 + 1;
                  } while (pdVar4 != pdVar1);
                  dVar12 = dVar13 + 0.0;
                }
                dVar12 = dVar12 + dVar14;
              }
              if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (double *)0x0) {
                operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
              }
              SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_70);
              if (!bVar2) {
                return false;
              }
            }
            (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] = dVar12;
            uVar9 = uVar9 + 1;
          } while (uVar9 != __new_size);
          if (num_mixture != 0 && !is_diagonal) {
            lVar8 = 0;
            do {
              bVar2 = SymmetricMatrix::Invert
                                ((SymmetricMatrix *)
                                 ((long)&((covariance_matrices->
                                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                         _vptr_SymmetricMatrix + lVar8),
                                 (SymmetricMatrix *)
                                 ((long)&((this_00->
                                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                         _vptr_SymmetricMatrix + lVar8));
              if (!bVar2) {
                return false;
              }
              lVar8 = lVar8 + 0x40;
            } while (__new_size << 6 != lVar8);
          }
        }
        buffer->precomputed_ = true;
      }
      if (num_mixture == 0) {
        uVar10 = 0x20000000;
        uVar11 = 0xc202a05f;
      }
      else {
        pdVar1 = (input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)length;
        uVar10 = 0x20000000;
        uVar11 = 0xc202a05f;
        uVar9 = 0;
        do {
          dVar14 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          lVar8 = *(long *)&(mean_vectors->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar9].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          local_78 = (double)CONCAT44(uVar11,uVar10);
          local_80 = uVar9;
          if (is_diagonal) {
            if (-1 < num_order) {
              uVar5 = 0;
              do {
                dVar12 = pdVar1[uVar5] - *(double *)(lVar8 + uVar5 * 8);
                local_70._8_8_ =
                     (covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9;
                local_70._0_8_ = &PTR__Row_00117bb0;
                local_60 = (uint)uVar5;
                pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,local_60);
                dVar14 = dVar14 + (dVar12 * dVar12) / *pdVar3;
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
            }
          }
          else if (-1 < num_order) {
            pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = 0;
            do {
              pdVar4[uVar5] = pdVar1[uVar5] - *(double *)(lVar8 + uVar5 * 8);
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
            if (-1 < num_order) {
              uVar5 = 0;
              do {
                dVar12 = 0.0;
                uVar6 = 0;
                do {
                  dVar13 = pdVar4[uVar6];
                  local_70._8_8_ =
                       (this_00->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9;
                  local_70._0_8_ = &PTR__Row_00117bb0;
                  local_60 = (uint)uVar5;
                  pdVar3 = SymmetricMatrix::Row::operator[]((Row *)local_70,(int)uVar6);
                  dVar12 = dVar12 + dVar13 * *pdVar3;
                  uVar6 = uVar6 + 1;
                } while (uVar7 != uVar6);
                dVar14 = dVar14 + dVar12 * pdVar4[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar7);
            }
          }
          uVar9 = local_80;
          dVar12 = log((weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_80]);
          dVar12 = dVar14 * -0.5 + dVar12;
          if (components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) {
            (components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar9] = dVar12;
          }
          dVar14 = AddInLogSpace(local_78,dVar12);
          uVar10 = SUB84(dVar14,0);
          uVar11 = (undefined4)((ulong)dVar14 >> 0x20);
          uVar9 = uVar9 + 1;
        } while (uVar9 != __new_size);
      }
      if (log_probability != (double *)0x0) {
        *log_probability = (double)CONCAT44(uVar11,uVar10);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool GaussianMixtureModeling::CalculateLogProbability(
    int num_order, int num_mixture, bool is_diagonal, bool check_size,
    const std::vector<double>& input_vector, const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<double>* components_of_log_probability, double* log_probability,
    GaussianMixtureModeling::Buffer* buffer) {
  // Check inputs.
  const int length(num_order + 1);
  if (num_mixture < 0 ||
      input_vector.size() != static_cast<std::size_t>(length) ||
      NULL == buffer) {
    return false;
  }

  // Check size of GMM.
  if (check_size && !CheckGmm(num_mixture, length, weights, mean_vectors,
                              covariance_matrices)) {
    return false;
  }

  // Prepare memories.
  if (components_of_log_probability &&
      components_of_log_probability->size() !=
          static_cast<std::size_t>(num_mixture)) {
    components_of_log_probability->resize(num_mixture);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(length)) {
    buffer->d_.resize(length);
  }
  if (buffer->gconsts_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->gconsts_.resize(num_mixture);
  }
  if (buffer->precisions_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->precisions_.resize(num_mixture);
  }

  if (!buffer->precomputed_) {
    // Precompute constant of log likelihood without multiplying -0.5.
    for (int k(0); k < num_mixture; ++k) {
      double gconst(length * std::log(sptk::kTwoPi));
      double log_determinant(0.0);
      if (is_diagonal) {
        for (int l(0); l <= num_order; ++l) {
          log_determinant += std::log(covariance_matrices[k][l][l]);
        }
        gconst += log_determinant;
      } else {
        SymmetricMatrix tmp;
        std::vector<double> diag;
        if (!covariance_matrices[k].CholeskyDecomposition(&tmp, &diag)) {
          return false;
        }
        log_determinant += std::accumulate(
            diag.begin(), diag.end(), 0.0,
            [](double acc, double x) { return acc + std::log(x); });
        gconst += log_determinant;
      }
      buffer->gconsts_[k] = gconst;
    }

    // Precompute inverse of covariance matrix.
    if (!is_diagonal) {
      for (int k(0); k < num_mixture; ++k) {
        if (!covariance_matrices[k].Invert(&(buffer->precisions_[k]))) {
          return false;
        }
      }
    }

    buffer->precomputed_ = true;
  }

  const double* x(&(input_vector[0]));
  double total(sptk::kLogZero);

  // Compute log probability of data.
  for (int k(0); k < num_mixture; ++k) {
    double sum(buffer->gconsts_[k]);
    const double* mu(&(mean_vectors[k][0]));
    if (is_diagonal) {
      for (int l(0); l <= num_order; ++l) {
        const double diff(x[l] - mu[l]);
        sum += diff * diff / covariance_matrices[k][l][l];
      }
    } else {
      double* d(&(buffer->d_[0]));
      for (int l(0); l <= num_order; ++l) {
        d[l] = x[l] - mu[l];
      }
      for (int l(0); l <= num_order; ++l) {
        double tmp(0.0);
        for (int m(0); m <= num_order; ++m) {
          tmp += d[m] * buffer->precisions_[k][l][m];
        }
        sum += tmp * d[l];
      }
    }

    const double p(std::log(weights[k]) - 0.5 * sum);
    if (components_of_log_probability) {
      (*components_of_log_probability)[k] = p;
    }
    total = AddInLogSpace(total, p);
  }

  if (log_probability) {
    *log_probability = total;
  }

  return true;
}